

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O2

void __thiscall
ParserTest_InvalidUnaryThrows_Test::TestBody(ParserTest_InvalidUnaryThrows_Test *this)

{
  allocator<char> local_79;
  string local_78;
  code *local_58 [2];
  code *local_48;
  code *local_40;
  code *local_38 [2];
  code *local_28;
  code *local_20;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"+x",&local_79);
  local_38[0] = Parser::parseUnary;
  local_38[1] = (code *)0x0;
  local_20 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  testThrow(&local_78,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_38);
  std::_Function_base::~_Function_base((_Function_base *)local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"--4",&local_79);
  local_58[0] = Parser::parseUnary;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  testThrow(&local_78,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_58);
  std::_Function_base::~_Function_base((_Function_base *)local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

TEST(ParserTest, InvalidUnaryThrows)
{
  testThrow("+x", &Parser::parseUnary);
  testThrow("--4", &Parser::parseUnary);
}